

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int deflateReset(z_streamp_conflict strm)

{
  deflate_state *s;
  Posf *__s;
  int iVar1;
  uLong uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = -2;
  if ((((strm != (z_streamp_conflict)0x0) &&
       (s = (deflate_state *)strm->state, s != (deflate_state *)0x0)) &&
      (strm->zalloc != (alloc_func)0x0)) && (strm->zfree != (free_func)0x0)) {
    strm->total_in = 0;
    strm->total_out = 0;
    strm->msg = (char *)0x0;
    strm->data_type = 2;
    s->pending = 0;
    s->pending_out = s->pending_buf;
    iVar1 = s->wrap;
    if (iVar1 < 0) {
      iVar1 = -iVar1;
      s->wrap = iVar1;
    }
    iVar3 = 0x2a;
    if (iVar1 == 0) {
      iVar3 = 0x71;
    }
    s->status = iVar3;
    if (iVar1 == 2) {
      uVar2 = crc32(0,(uchar *)0x0,0);
    }
    else {
      uVar2 = adler32(0,(Bytef *)0x0,0);
    }
    strm->adler = uVar2;
    iVar1 = 0;
    s->last_flush = 0;
    _tr_init(s);
    s->window_size = (ulong)s->w_size * 2;
    __s = s->head;
    uVar4 = (ulong)(s->hash_size - 1);
    __s[uVar4] = 0;
    memset(__s,0,uVar4 * 2);
    iVar3 = s->level;
    s->max_lazy_match = (uint)configuration_table[iVar3].max_lazy;
    s->good_match = (uint)configuration_table[iVar3].good_length;
    s->nice_match = (uint)configuration_table[iVar3].nice_length;
    s->max_chain_length = (uint)configuration_table[iVar3].max_chain;
    s->block_start = 0;
    s->lookahead = 0;
    s->prev_length = 2;
    s->match_length = 2;
    s->match_available = 0;
    s->strstart = 0;
    s->ins_h = 0;
  }
  return iVar1;
}

Assistant:

int ZEXPORT deflateReset (z_streamp strm)
{
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        strm->zalloc == (alloc_func)0 || strm->zfree == (free_func)0) {
        return Z_STREAM_ERROR;
    }

    strm->total_in = strm->total_out = 0;
    strm->msg = Z_NULL; /* use zfree if we ever allocate msg dynamically */
    strm->data_type = Z_UNKNOWN;

    s = (deflate_state *)strm->state;
    s->pending = 0;
    s->pending_out = s->pending_buf;

    if (s->wrap < 0) {
        s->wrap = -s->wrap; /* was made negative by deflate(..., Z_FINISH); */
    }
    s->status = s->wrap ? INIT_STATE : BUSY_STATE;
    strm->adler =
#ifdef GZIP
        s->wrap == 2 ? crc32(0L, Z_NULL, 0) :
#endif
        adler32(0L, Z_NULL, 0);
    s->last_flush = Z_NO_FLUSH;

    _tr_init(s);
    lm_init(s);

    return Z_OK;
}